

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprFor * AnalyzeForEach(ExpressionContext *ctx,SynForEach *syntax)

{
  uint uVar1;
  uint uVar2;
  ModuleData *pMVar3;
  TypeBase *pTVar4;
  ScopeData *pSVar5;
  ExprBase *pEVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ExprDereference *node;
  SynBase *pSVar12;
  ExprBase *pEVar13;
  long lVar14;
  undefined4 extraout_var;
  TypeRef *pTVar15;
  undefined4 extraout_var_00;
  SynIdentifier *pSVar16;
  undefined4 extraout_var_02;
  _func_int **pp_Var17;
  VariableData *pVVar18;
  ExprBase *pEVar19;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ExprBase *pEVar20;
  VariableData *pVVar21;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  ExprBase *pEVar22;
  undefined4 extraout_var_28;
  ExprBase *pEVar23;
  ExprFor *pEVar24;
  char *__function;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> *this;
  ExprBase *in_R8;
  TypeBase *pTVar25;
  ulong uVar26;
  ExpressionContext *ctx_00;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  TypeBase *local_148;
  IntrusiveList<ExprBase> initializers;
  SmallArray<VariableData_*,_4U> iterators;
  IntrusiveList<ExprBase> definitions;
  IntrusiveList<ExprBase> conditions;
  IntrusiveList<ExprBase> increments;
  SmallArray<ArgumentData,_1U> arguments;
  VariableHandle *variable;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_08;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  initializers.head = (ExprBase *)0x0;
  initializers.tail = (ExprBase *)0x0;
  conditions.head = (ExprBase *)0x0;
  conditions.tail = (ExprBase *)0x0;
  definitions.head = (ExprBase *)0x0;
  definitions.tail = (ExprBase *)0x0;
  increments.head = (ExprBase *)0x0;
  increments.tail = (ExprBase *)0x0;
  iterators.allocator = ctx->allocator;
  iterators.data = iterators.little;
  iterators.count = 0;
  iterators.max = 4;
  ctx_00 = (ExpressionContext *)(syntax->iterators).head;
  if (ctx_00 != (ExpressionContext *)0x0) {
    do {
      pSVar12 = &ExpressionContext::MakeInternal(ctx,(SynBase *)ctx_00)->super_SynBase;
      pEVar13 = AnalyzeExpression(ctx,(SynBase *)(ctx_00->uniqueDependencies).little[4]);
      if ((pEVar13->type == (TypeBase *)0x0) || (pEVar13->type->typeID != 0)) {
        pMVar3 = (ctx_00->uniqueDependencies).little[2];
        bVar8 = true;
        if ((pMVar3 == (ModuleData *)0x0) ||
           (local_148 = AnalyzeType(ctx,(SynBase *)pMVar3,true,(bool *)0x0),
           local_148 == (TypeBase *)0x0)) {
          local_148 = (TypeBase *)0x0;
        }
        else {
          if (local_148->typeID == 0) goto LAB_001fbf03;
          bVar8 = false;
        }
        pTVar25 = pEVar13->type;
        if (pTVar25 == (TypeBase *)0x0) {
LAB_001fbdff:
          bVar7 = AssertValueExpression(ctx,(SynBase *)ctx_00,pEVar13);
          if (!bVar7) goto LAB_001fbf03;
          pTVar25 = pEVar13->type;
          if ((pTVar25 == (TypeBase *)0x0) || (pEVar19 = pEVar13, pTVar25->typeID != 0x15)) {
            pMVar3 = (ctx_00->uniqueDependencies).little[4];
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar9);
            (pSVar16->super_SynBase).typeID = 4;
            (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
            (pSVar16->super_SynBase).end = (Lexeme *)0x0;
            (pSVar16->super_SynBase).pos.begin = (char *)0x0;
            (pSVar16->super_SynBase).pos.end = (char *)0x0;
            *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
            *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
            (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
            (pSVar16->name).begin = "start";
            (pSVar16->name).end = "";
            pEVar19 = CreateMemberAccess(ctx,(SynBase *)pMVar3,pEVar13,pSVar16,false);
            in_R8 = (ExprBase *)0x0;
            pEVar19 = CreateFunctionCall(ctx,pSVar12,pEVar19,(IntrusiveList<TypeHandle>)ZEXT816(0),
                                         (SynCallArgument *)0x0,false);
            pTVar25 = pEVar19->type;
            if (pTVar25 != (TypeBase *)0x0) {
              if (pTVar25->typeID == 0x15) goto LAB_001fc8db;
              if (pTVar25->typeID == 0) goto LAB_001fbf03;
            }
            pVVar18 = anon_unknown.dwarf_1117a3::AllocateTemporary(ctx,pSVar12,pTVar25);
            pEVar13 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
            pEVar13 = CreateAssignment(ctx,pSVar12,pEVar13,pEVar19);
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar19 = (ExprBase *)CONCAT44(extraout_var_12,iVar9);
            pTVar25 = ctx->typeVoid;
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var17 = (_func_int **)CONCAT44(extraout_var_13,iVar9);
            *pp_Var17 = (_func_int *)0x0;
            pp_Var17[1] = (_func_int *)pVVar18;
            pp_Var17[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var17 + 3) = 0;
            pEVar19->typeID = 0x1e;
            pEVar19->source = pSVar12;
            pEVar19->type = pTVar25;
            pEVar19->next = (ExprBase *)0x0;
            pEVar19->listed = false;
            pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
            pEVar19[1]._vptr_ExprBase = pp_Var17;
            *(ExprBase **)&pEVar19[1].typeID = pEVar13;
            IntrusiveList<ExprBase>::push_back(&initializers,pEVar19);
            pEVar13 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_14,iVar9);
            (pSVar16->super_SynBase).typeID = 4;
            (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
            (pSVar16->super_SynBase).end = (Lexeme *)0x0;
            (pSVar16->super_SynBase).pos.begin = (char *)0x0;
            (pSVar16->super_SynBase).pos.end = (char *)0x0;
            *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
            *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
            (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
            (pSVar16->name).begin = "hasnext";
            (pSVar16->name).end = "";
            pEVar13 = CreateMemberAccess(ctx,pSVar12,pEVar13,pSVar16,false);
            pEVar13 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar13,
                                         (IntrusiveList<TypeHandle>)ZEXT816(0),
                                         (SynCallArgument *)0x0,false);
            IntrusiveList<ExprBase>::push_back(&conditions,pEVar13);
            pEVar13 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_15,iVar9);
            (pSVar16->super_SynBase).typeID = 4;
            (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
            (pSVar16->super_SynBase).end = (Lexeme *)0x0;
            (pSVar16->super_SynBase).pos.begin = (char *)0x0;
            (pSVar16->super_SynBase).pos.end = (char *)0x0;
            *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
            *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
            (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
            (pSVar16->name).begin = "next";
            (pSVar16->name).end = "";
            pEVar13 = CreateMemberAccess(ctx,pSVar12,pEVar13,pSVar16,false);
            in_R8 = (ExprBase *)0x0;
            pEVar19 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar13,
                                         (IntrusiveList<TypeHandle>)ZEXT816(0),
                                         (SynCallArgument *)0x0,false);
            if ((bool)(bVar8 | local_148 == ctx->typeAuto)) {
              pTVar15 = (TypeRef *)pEVar19->type;
            }
            else {
              pTVar15 = ExpressionContext::GetReferenceType(ctx,local_148);
            }
            if ((pTVar15 == (TypeRef *)0x0) || ((pTVar15->super_TypeBase).typeID != 0)) {
              pMVar3 = (ctx_00->uniqueDependencies).little[3];
              name_00.end = (char *)in_R8;
              name_00.begin = (char *)pMVar3[1].source;
              anon_unknown.dwarf_1117a3::CheckVariableConflict
                        ((anon_unknown_dwarf_1117a3 *)ctx,ctx_00,
                         *(SynBase **)&pMVar3->importedFunctionCount,name_00);
              uVar11 = anon_unknown.dwarf_1117a3::AllocateVariableInScope
                                 (ctx,(SynBase *)ctx_00,(pTVar15->super_TypeBase).alignment,
                                  &pTVar15->super_TypeBase);
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
              pVVar18 = (VariableData *)CONCAT44(extraout_var_16,iVar9);
              uVar1 = (pTVar15->super_TypeBase).alignment;
              in_R8 = (ExprBase *)(ulong)uVar1;
              pSVar16 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[3];
              uVar2 = ctx->uniqueVariableId;
              ctx->uniqueVariableId = uVar2 + 1;
              VariableData::VariableData
                        (pVVar18,ctx->allocator,(SynBase *)ctx_00,ctx->scope,uVar1,
                         &pTVar15->super_TypeBase,pSVar16,uVar11,uVar2);
              pVVar18->isReference = (pTVar15->super_TypeBase).typeID == 0x12;
              bVar8 = anon_unknown.dwarf_1117a3::IsLookupOnlyVariable
                                ((ExpressionContext *)ctx->scope,pVVar18);
              if (bVar8) {
                pVVar18->lookupOnly = true;
              }
              if (iterators.count == iterators.max) {
                SmallArray<VariableData_*,_4U>::grow(&iterators,iterators.count);
              }
              if (iterators.data == (VariableData **)0x0) goto LAB_001fd089;
              uVar26 = iterators._8_8_ & 0xffffffff;
              iterators.count = iterators.count + 1;
              iterators.data[uVar26] = pVVar18;
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pEVar13 = (ExprBase *)CONCAT44(extraout_var_17,iVar9);
              pTVar25 = ctx->typeVoid;
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pp_Var17 = (_func_int **)CONCAT44(extraout_var_18,iVar9);
              *pp_Var17 = (_func_int *)0x0;
              pp_Var17[1] = (_func_int *)pVVar18;
              pp_Var17[2] = (_func_int *)0x0;
              *(undefined1 *)(pp_Var17 + 3) = 0;
              pEVar20 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              pEVar19 = CreateAssignment(ctx,pSVar12,pEVar20,pEVar19);
              pEVar13->typeID = 0x1e;
              pEVar13->source = (SynBase *)ctx_00;
              pEVar13->type = pTVar25;
              pEVar13->next = (ExprBase *)0x0;
              pEVar13->listed = false;
              pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
              pEVar13[1]._vptr_ExprBase = pp_Var17;
              *(ExprBase **)&pEVar13[1].typeID = pEVar19;
              this = &definitions;
              goto LAB_001fbf0b;
            }
          }
          else {
LAB_001fc8db:
            pVVar18 = anon_unknown.dwarf_1117a3::AllocateTemporary(ctx,pSVar12,pTVar25);
            pEVar13 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
            pEVar13 = CreateAssignment(ctx,pSVar12,pEVar13,pEVar19);
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar20 = (ExprBase *)CONCAT44(extraout_var_19,iVar9);
            pTVar4 = ctx->typeVoid;
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var17 = (_func_int **)CONCAT44(extraout_var_20,iVar9);
            *pp_Var17 = (_func_int *)0x0;
            pp_Var17[1] = (_func_int *)pVVar18;
            pp_Var17[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var17 + 3) = 0;
            pEVar20->typeID = 0x1e;
            pEVar20->source = pSVar12;
            pEVar20->type = pTVar4;
            pEVar20->next = (ExprBase *)0x0;
            pEVar20->listed = false;
            pEVar20->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
            pEVar20[1]._vptr_ExprBase = pp_Var17;
            *(ExprBase **)&pEVar20[1].typeID = pEVar13;
            IntrusiveList<ExprBase>::push_back(&initializers,pEVar20);
            if (pEVar19->typeID == 0x26) {
              if (*(char *)(pEVar19[1]._vptr_ExprBase + 4) == '\0') {
                anon_unknown.dwarf_1117a3::Stop
                          (ctx,(SynBase *)ctx_00,"ERROR: function is not a coroutine");
              }
            }
            else {
              in_R8 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              name_02.end = "";
              name_02.begin = "__assertCoroutine";
              pEVar13 = CreateFunctionCall1(ctx,pSVar12,name_02,in_R8,false,true,true);
              IntrusiveList<ExprBase>::push_back(&initializers,pEVar13);
            }
            if (((bool)(bVar8 | local_148 == ctx->typeAuto)) &&
               (local_148 = (TypeBase *)pTVar25[1]._vptr_TypeBase, local_148 == ctx->typeAuto)) {
              anon_unknown.dwarf_1117a3::Report
                        (ctx,(SynBase *)ctx_00,"ERROR: function type is unresolved at this point");
            }
            else {
              pMVar3 = (ctx_00->uniqueDependencies).little[3];
              name_01.end = (char *)in_R8;
              name_01.begin = (char *)pMVar3[1].source;
              anon_unknown.dwarf_1117a3::CheckVariableConflict
                        ((anon_unknown_dwarf_1117a3 *)ctx,ctx_00,
                         *(SynBase **)&pMVar3->importedFunctionCount,name_01);
              uVar11 = anon_unknown.dwarf_1117a3::AllocateVariableInScope
                                 (ctx,(SynBase *)ctx_00,local_148->alignment,local_148);
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
              pVVar21 = (VariableData *)CONCAT44(extraout_var_21,iVar9);
              uVar1 = local_148->alignment;
              pSVar16 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[3];
              uVar2 = ctx->uniqueVariableId;
              ctx->uniqueVariableId = uVar2 + 1;
              VariableData::VariableData
                        (pVVar21,ctx->allocator,(SynBase *)ctx_00,ctx->scope,uVar1,local_148,pSVar16
                         ,uVar11,uVar2);
              bVar8 = anon_unknown.dwarf_1117a3::IsLookupOnlyVariable
                                ((ExpressionContext *)ctx->scope,pVVar21);
              if (bVar8) {
                pVVar21->lookupOnly = true;
              }
              if (iterators.count == iterators.max) {
                SmallArray<VariableData_*,_4U>::grow(&iterators,iterators.count);
              }
              if (iterators.data == (VariableData **)0x0) {
LAB_001fd089:
                __function = 
                "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]"
                ;
LAB_001fd09e:
                __assert_fail("data",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x162,__function);
              }
              uVar26 = iterators._8_8_ & 0xffffffff;
              iterators.count = iterators.count + 1;
              iterators.data[uVar26] = pVVar21;
              pEVar13 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              pEVar13 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar13,
                                           (IntrusiveList<TypeHandle>)ZEXT816(0),
                                           (SynCallArgument *)0x0,false);
              if (pEVar13 != (ExprBase *)0x0) {
                pTVar15 = ExpressionContext::GetReferenceType(ctx,local_148);
                pEVar19 = pEVar13;
                if (pTVar15 == (TypeRef *)pEVar13->type) {
                  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                  pEVar19 = (ExprBase *)CONCAT44(extraout_var_22,iVar9);
                  pEVar19->typeID = 0x16;
                  pEVar19->source = (SynBase *)ctx_00;
                  pEVar19->type = local_148;
                  pEVar19->next = (ExprBase *)0x0;
                  pEVar19->listed = false;
                  pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6518;
                  pEVar19[1]._vptr_ExprBase = (_func_int **)pEVar13;
                }
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                pEVar13 = (ExprBase *)CONCAT44(extraout_var_23,iVar9);
                pTVar25 = ctx->typeVoid;
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                pp_Var17 = (_func_int **)CONCAT44(extraout_var_24,iVar9);
                *pp_Var17 = (_func_int *)0x0;
                pp_Var17[1] = (_func_int *)pVVar21;
                pp_Var17[2] = (_func_int *)0x0;
                *(undefined1 *)(pp_Var17 + 3) = 0;
                pEVar20 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar21,false);
                pEVar19 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar20,pEVar19);
                pEVar13->typeID = 0x1e;
                pEVar13->source = (SynBase *)ctx_00;
                pEVar13->type = pTVar25;
                pEVar13->next = (ExprBase *)0x0;
                pEVar13->listed = false;
                pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
                pEVar13[1]._vptr_ExprBase = pp_Var17;
                *(ExprBase **)&pEVar13[1].typeID = pEVar19;
                IntrusiveList<ExprBase>::push_back(&initializers,pEVar13);
              }
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar13 = (ExprBase *)CONCAT44(extraout_var_25,iVar9);
              pTVar25 = ctx->typeBool;
              pEVar19 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              name_03.end = "";
              name_03.begin = "isCoroutineReset";
              pEVar19 = CreateFunctionCall1(ctx,(SynBase *)ctx_00,name_03,pEVar19,false,false,true);
              pEVar13->typeID = 0x13;
              pEVar13->source = (SynBase *)ctx_00;
              pEVar13->type = pTVar25;
              pEVar13->next = (ExprBase *)0x0;
              pEVar13->listed = false;
              pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6828;
              *(undefined4 *)&pEVar13->field_0x2c = 4;
              pEVar13[1]._vptr_ExprBase = (_func_int **)pEVar19;
              IntrusiveList<ExprBase>::push_back(&conditions,pEVar13);
              pEVar13 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              in_R8 = (ExprBase *)0x0;
              pEVar13 = CreateFunctionCall(ctx,(SynBase *)ctx_00,pEVar13,
                                           (IntrusiveList<TypeHandle>)ZEXT816(0),
                                           (SynCallArgument *)0x0,false);
              if (pEVar13 != (ExprBase *)0x0) {
                pTVar15 = ExpressionContext::GetReferenceType(ctx,local_148);
                pEVar19 = pEVar13;
                if (pTVar15 == (TypeRef *)pEVar13->type) {
                  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                  pEVar19 = (ExprBase *)CONCAT44(extraout_var_26,iVar9);
                  pEVar19->typeID = 0x16;
                  pEVar19->source = (SynBase *)ctx_00;
                  pEVar19->type = local_148;
                  pEVar19->next = (ExprBase *)0x0;
                  pEVar19->listed = false;
                  pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6518;
                  pEVar19[1]._vptr_ExprBase = (_func_int **)pEVar13;
                }
                pEVar13 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar21,false);
                pEVar13 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar13,pEVar19);
                IntrusiveList<ExprBase>::push_back(&increments,pEVar13);
              }
            }
          }
        }
        else {
          if (pTVar25->typeID == 0x14) {
            lVar14 = 0x88;
            if ((bool)(bVar8 | local_148 == ctx->typeAuto)) {
LAB_001fbd71:
              local_148 = *(TypeBase **)((long)&pTVar25->_vptr_TypeBase + lVar14);
            }
          }
          else {
            if (pTVar25->typeID != 0x13) goto LAB_001fbdff;
            lVar14 = 0x60;
            if (bVar8 || local_148 == ctx->typeAuto) goto LAB_001fbd71;
          }
          if (pEVar13->typeID != 0x16) {
            if (pEVar13->typeID == 0x22) {
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pSVar12 = pEVar13->source;
              pTVar15 = ExpressionContext::GetReferenceType(ctx,pEVar13->type);
              iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar10);
              pVVar18 = (VariableData *)pEVar13[1]._vptr_ExprBase;
              variable->source = pEVar13->source;
              variable->variable = pVVar18;
              variable->next = (VariableHandle *)0x0;
              variable->listed = false;
              ExprGetAddress::ExprGetAddress
                        ((ExprGetAddress *)CONCAT44(extraout_var,iVar9),pSVar12,
                         &pTVar15->super_TypeBase,variable);
            }
            else {
              pVVar18 = anon_unknown.dwarf_1117a3::AllocateTemporary(ctx,pEVar13->source,pTVar25);
              pSVar12 = pEVar13->source;
              pEVar19 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              pEVar19 = CreateAssignment(ctx,pSVar12,pEVar19,pEVar13);
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pEVar20 = (ExprBase *)CONCAT44(extraout_var_02,iVar9);
              pSVar12 = pEVar13->source;
              pTVar25 = ctx->typeVoid;
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pp_Var17 = (_func_int **)CONCAT44(extraout_var_03,iVar9);
              *pp_Var17 = (_func_int *)0x0;
              pp_Var17[1] = (_func_int *)pVVar18;
              pp_Var17[2] = (_func_int *)0x0;
              *(undefined1 *)(pp_Var17 + 3) = 0;
              pEVar20->typeID = 0x1e;
              pEVar20->source = pSVar12;
              pEVar20->type = pTVar25;
              pEVar20->next = (ExprBase *)0x0;
              pEVar20->listed = false;
              pEVar20->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
              pEVar20[1]._vptr_ExprBase = pp_Var17;
              *(ExprBase **)&pEVar20[1].typeID = pEVar19;
              pSVar12 = pEVar13->source;
              pEVar19 = CreateVariableAccess(ctx,pSVar12,pVVar18,false);
              pEVar19 = CreateGetAddress(ctx,pSVar12,pEVar19);
              CreateSequence(ctx,pSVar12,pEVar20,pEVar19);
            }
          }
          pVVar18 = anon_unknown.dwarf_1117a3::AllocateTemporary(ctx,(SynBase *)ctx_00,ctx->typeInt)
          ;
          pEVar19 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar18,false);
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar20 = (ExprBase *)CONCAT44(extraout_var_04,iVar9);
          pTVar25 = ctx->typeInt;
          pEVar20->typeID = 6;
          pEVar20->source = (SynBase *)ctx_00;
          pEVar20->type = pTVar25;
          pEVar20->next = (ExprBase *)0x0;
          pEVar20->listed = false;
          pEVar20->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
          pEVar20[1]._vptr_ExprBase = (_func_int **)0x0;
          pEVar19 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar19,pEVar20);
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar20 = (ExprBase *)CONCAT44(extraout_var_05,iVar9);
          pTVar25 = ctx->typeVoid;
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var17 = (_func_int **)CONCAT44(extraout_var_06,iVar9);
          *pp_Var17 = (_func_int *)0x0;
          pp_Var17[1] = (_func_int *)pVVar18;
          pp_Var17[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var17 + 3) = 0;
          pEVar20->typeID = 0x1e;
          pEVar20->source = (SynBase *)ctx_00;
          pEVar20->type = pTVar25;
          pEVar20->next = (ExprBase *)0x0;
          pEVar20->listed = false;
          pEVar20->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
          pEVar20[1]._vptr_ExprBase = pp_Var17;
          *(ExprBase **)&pEVar20[1].typeID = pEVar19;
          IntrusiveList<ExprBase>::push_back(&initializers,pEVar20);
          pEVar19 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar18,false);
          pMVar3 = (ctx_00->uniqueDependencies).little[4];
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_07,iVar9);
          (pSVar16->super_SynBase).typeID = 4;
          (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
          (pSVar16->super_SynBase).end = (Lexeme *)0x0;
          (pSVar16->super_SynBase).pos.begin = (char *)0x0;
          (pSVar16->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
          (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
          (pSVar16->name).begin = "size";
          (pSVar16->name).end = "";
          pEVar20 = CreateMemberAccess(ctx,(SynBase *)pMVar3,pEVar13,pSVar16,false);
          pEVar19 = CreateBinaryOp(ctx,(SynBase *)ctx_00,SYN_BINARY_OP_LESS,pEVar19,pEVar20);
          IntrusiveList<ExprBase>::push_back(&conditions,pEVar19);
          pTVar15 = ExpressionContext::GetReferenceType(ctx,local_148);
          pMVar3 = (ctx_00->uniqueDependencies).little[3];
          name.end = (char *)pEVar20;
          name.begin = (char *)pMVar3[1].source;
          anon_unknown.dwarf_1117a3::CheckVariableConflict
                    ((anon_unknown_dwarf_1117a3 *)ctx,ctx_00,
                     *(SynBase **)&pMVar3->importedFunctionCount,name);
          uVar11 = anon_unknown.dwarf_1117a3::AllocateVariableInScope
                             (ctx,(SynBase *)ctx_00,(pTVar15->super_TypeBase).alignment,
                              &pTVar15->super_TypeBase);
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
          pVVar21 = (VariableData *)CONCAT44(extraout_var_08,iVar9);
          uVar1 = (pTVar15->super_TypeBase).alignment;
          pSVar16 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[3];
          uVar2 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar2 + 1;
          VariableData::VariableData
                    (pVVar21,ctx->allocator,(SynBase *)ctx_00,ctx->scope,uVar1,
                     &pTVar15->super_TypeBase,pSVar16,uVar11,uVar2);
          pVVar21->isReference = true;
          bVar8 = anon_unknown.dwarf_1117a3::IsLookupOnlyVariable
                            ((ExpressionContext *)ctx->scope,pVVar21);
          if (bVar8) {
            pVVar21->lookupOnly = true;
          }
          if (iterators.count == iterators.max) {
            SmallArray<VariableData_*,_4U>::grow(&iterators,iterators.count);
          }
          if (iterators.data == (VariableData **)0x0) goto LAB_001fd089;
          uVar26 = iterators._8_8_ & 0xffffffff;
          iterators.count = iterators.count + 1;
          iterators.data[uVar26] = pVVar21;
          arguments.allocator = ctx->allocator;
          arguments.little[0].source = (SynBase *)0x0;
          arguments.little[0].isExplicit = false;
          arguments.data = arguments.little;
          arguments.little[0].value = (ExprBase *)0x0;
          arguments.little[0].valueFunction = (FunctionData *)0x0;
          arguments.little[0].name = (SynIdentifier *)0x0;
          arguments.little[0].type = (TypeBase *)0x0;
          arguments.count = 0;
          arguments.max = 1;
          pTVar25 = ctx->typeInt;
          pEVar19 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar18,false);
          if (arguments.count == arguments.max) {
            SmallArray<ArgumentData,_1U>::grow(&arguments,arguments.count);
          }
          if (arguments.data == (ArgumentData *)0x0) {
            __function = 
            "void SmallArray<ArgumentData, 1>::push_back(const T &) [T = ArgumentData, N = 1]";
            goto LAB_001fd09e;
          }
          uVar26 = (ulong)arguments.count;
          arguments.count = arguments.count + 1;
          arguments.data[uVar26].source = (SynBase *)ctx_00;
          arguments.data[uVar26].isExplicit = false;
          arguments.data[uVar26].name = (SynIdentifier *)0x0;
          arguments.data[uVar26].type = pTVar25;
          arguments.data[uVar26].value = pEVar19;
          arguments.data[uVar26].valueFunction = (FunctionData *)0x0;
          arguments_00.count = arguments.count;
          arguments_00.data = arguments.data;
          arguments_00._12_4_ = 0;
          in_R8 = (ExprBase *)(ulong)arguments.count;
          pEVar13 = CreateArrayIndex(ctx,(SynBase *)ctx_00,pEVar13,arguments_00);
          if ((pEVar13 == (ExprBase *)0x0) || (pEVar13->typeID != 0x16)) {
            __assert_fail("isType<ExprDereference>(arrayIndex)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2c46,"ExprFor *AnalyzeForEach(ExpressionContext &, SynForEach *)");
          }
          pEVar13 = (ExprBase *)pEVar13[1]._vptr_ExprBase;
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar19 = (ExprBase *)CONCAT44(extraout_var_09,iVar9);
          pTVar25 = ctx->typeVoid;
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var17 = (_func_int **)CONCAT44(extraout_var_10,iVar9);
          *pp_Var17 = (_func_int *)0x0;
          pp_Var17[1] = (_func_int *)pVVar21;
          pp_Var17[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var17 + 3) = 0;
          pEVar20 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar21,false);
          pEVar13 = CreateAssignment(ctx,(SynBase *)ctx_00,pEVar20,pEVar13);
          pEVar19->typeID = 0x1e;
          pEVar19->source = (SynBase *)ctx_00;
          pEVar19->type = pTVar25;
          pEVar19->next = (ExprBase *)0x0;
          pEVar19->listed = false;
          pEVar19->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
          pEVar19[1]._vptr_ExprBase = pp_Var17;
          *(ExprBase **)&pEVar19[1].typeID = pEVar13;
          IntrusiveList<ExprBase>::push_back(&definitions,pEVar19);
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar13 = (ExprBase *)CONCAT44(extraout_var_11,iVar9);
          pTVar25 = ctx->typeInt;
          pEVar19 = CreateVariableAccess(ctx,(SynBase *)ctx_00,pVVar18,false);
          pEVar19 = CreateGetAddress(ctx,(SynBase *)ctx_00,pEVar19);
          pEVar13->typeID = 0x10;
          pEVar13->source = (SynBase *)ctx_00;
          pEVar13->type = pTVar25;
          pEVar13->next = (ExprBase *)0x0;
          pEVar13->listed = false;
          pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e67b8;
          pEVar13[1]._vptr_ExprBase = (_func_int **)pEVar19;
          *(undefined1 *)&pEVar13[1].typeID = 1;
          IntrusiveList<ExprBase>::push_back(&increments,pEVar13);
          SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
        }
      }
      else {
LAB_001fbf03:
        this = &initializers;
LAB_001fbf0b:
        IntrusiveList<ExprBase>::push_back(this,pEVar13);
      }
      ctx_00 = (ExpressionContext *)(ctx_00->uniqueDependencies).little[0];
    } while ((ctx_00 != (ExpressionContext *)0x0) &&
            (*(int *)&((InplaceStr *)&ctx_00->code)->begin == 0x29));
    if (iterators.count != 0) {
      uVar26 = 0;
      do {
        ExpressionContext::AddVariable(ctx,iterators.data[uVar26],true);
        uVar26 = uVar26 + 1;
      } while (uVar26 < (iterators._8_8_ & 0xffffffff));
    }
  }
  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar13 = (ExprBase *)CONCAT44(extraout_var_27,iVar9);
  pTVar25 = ctx->typeVoid;
  pEVar13->typeID = 0x36;
  pEVar13->source = &syntax->super_SynBase;
  pEVar13->type = pTVar25;
  pEVar19 = (ExprBase *)0x0;
  pEVar13->next = (ExprBase *)0x0;
  pEVar13->listed = false;
  pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c88;
  pEVar13[1]._vptr_ExprBase = (_func_int **)initializers.head;
  *(ExprBase **)&pEVar13[1].typeID = initializers.tail;
  pEVar13[1].source = (SynBase *)0x0;
  if (conditions.head != (ExprBase *)0x0) {
    pEVar19 = (ExprBase *)0x0;
    pEVar20 = conditions.head;
    do {
      pEVar22 = pEVar20;
      if (pEVar19 != (ExprBase *)0x0) {
        pEVar22 = CreateBinaryOp(ctx,&syntax->super_SynBase,SYN_BINARY_OP_LOGICAL_AND,pEVar19,
                                 pEVar20);
      }
      pEVar19 = pEVar22;
      pEVar20 = pEVar20->next;
    } while (pEVar20 != (ExprBase *)0x0);
  }
  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar20 = (ExprBase *)CONCAT44(extraout_var_28,iVar9);
  pTVar25 = ctx->typeVoid;
  pEVar20->typeID = 0x36;
  pEVar20->source = &syntax->super_SynBase;
  pEVar20->type = pTVar25;
  pEVar20->next = (ExprBase *)0x0;
  pEVar20->listed = false;
  pEVar20->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c88;
  *(undefined4 *)&pEVar20[1]._vptr_ExprBase = increments.head._0_4_;
  *(undefined4 *)((long)&pEVar20[1]._vptr_ExprBase + 4) = increments.head._4_4_;
  pEVar20[1].typeID = (uint)increments.tail;
  *(undefined4 *)&pEVar20[1].field_0xc = increments.tail._4_4_;
  pEVar20[1].source = (SynBase *)0x0;
  if (syntax->body != (SynBase *)0x0) {
    pEVar22 = AnalyzeStatement(ctx,syntax->body);
    IntrusiveList<ExprBase>::push_back(&definitions,pEVar22);
  }
  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar6 = definitions.tail;
  pEVar22 = definitions.head;
  pEVar23 = (ExprBase *)CONCAT44(extraout_var_29,iVar9);
  pTVar25 = ctx->typeVoid;
  pSVar12 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  for (pSVar5 = ctx->scope; (pSVar5 != (ScopeData *)0x0 && (pSVar5->ownerType == (TypeBase *)0x0));
      pSVar5 = pSVar5->scope) {
    onwerFunction = pSVar5->ownerFunction;
    if (onwerFunction != (FunctionData *)0x0) goto LAB_001fcf81;
  }
  onwerFunction = (FunctionData *)0x0;
LAB_001fcf81:
  pSVar12 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar12,onwerFunction,ctx->scope);
  pEVar23->typeID = 0x36;
  pEVar23->source = &syntax->super_SynBase;
  pEVar23->type = pTVar25;
  pEVar23->next = (ExprBase *)0x0;
  pEVar23->listed = false;
  pEVar23->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c88;
  pEVar23[1]._vptr_ExprBase = (_func_int **)pEVar22;
  *(ExprBase **)&pEVar23[1].typeID = pEVar6;
  pEVar23[1].source = pSVar12;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP,true);
  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pEVar24 = (ExprFor *)CONCAT44(extraout_var_30,iVar9);
  pTVar25 = ctx->typeVoid;
  (pEVar24->super_ExprBase).typeID = 0x30;
  (pEVar24->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar24->super_ExprBase).type = pTVar25;
  (pEVar24->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar24->super_ExprBase).listed = false;
  (pEVar24->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6fd0;
  pEVar24->initializer = pEVar13;
  pEVar24->condition = pEVar19;
  pEVar24->increment = pEVar20;
  pEVar24->body = pEVar23;
  SmallArray<VariableData_*,_4U>::~SmallArray(&iterators);
  return pEVar24;
}

Assistant:

ExprFor* AnalyzeForEach(ExpressionContext &ctx, SynForEach *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> initializers;
	IntrusiveList<ExprBase> conditions;
	IntrusiveList<ExprBase> definitions;
	IntrusiveList<ExprBase> increments;

	SmallArray<VariableData*, 4> iterators(ctx.allocator);

	for(SynForEachIterator *curr = syntax->iterators.head; curr; curr = getType<SynForEachIterator>(curr->next))
	{
		SynBase *sourceInternal = ctx.MakeInternal(curr);

		ExprBase *value = AnalyzeExpression(ctx, curr->value);

		if(isType<TypeError>(value->type))
		{
			initializers.push_back(value);
			continue;
		}

		TypeBase *type = NULL;

		if(curr->type)
			type = AnalyzeType(ctx, curr->type);

		if(isType<TypeError>(type))
		{
			initializers.push_back(value);
			continue;
		}

		// Special implementation of for each for built-in arrays
		if(isType<TypeArray>(value->type) || isType<TypeUnsizedArray>(value->type))
		{
			if(!type || type == ctx.typeAuto)
			{
				if(TypeArray *valueType = getType<TypeArray>(value->type))
					type = valueType->subType;
				else if(TypeUnsizedArray *valueType = getType<TypeUnsizedArray>(value->type))
					type = valueType->subType;
			}

			ExprBase* wrapped = value;

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(value->source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				wrapped = node->value;
			}
			else if(!isType<TypeRef>(wrapped->type))
			{
				VariableData *storage = AllocateTemporary(ctx, value->source, wrapped->type);

				ExprBase *assignment = CreateAssignment(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(value->source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				wrapped = CreateSequence(ctx, value->source, definition, CreateGetAddress(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false)));
			}

			// Create initializer
			VariableData *iterator = AllocateTemporary(ctx, curr, ctx.typeInt);

			ExprBase *iteratorAssignment = CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false), new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(curr, ctx.typeInt, 0));

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorAssignment));

			// Create condition
			conditions.push_back(CreateBinaryOp(ctx, curr, SYN_BINARY_OP_LESS, CreateVariableAccess(ctx, curr, iterator, false), CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), false)));

			// Create definition
			type = ctx.GetReferenceType(type);

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = true;

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(curr, false, NULL, ctx.typeInt, CreateVariableAccess(ctx, curr, iterator, false)));

			ExprBase *arrayIndex = CreateArrayIndex(ctx, curr, value, arguments);

			assert(isType<ExprDereference>(arrayIndex));

			if(ExprDereference *node = getType<ExprDereference>(arrayIndex))
				arrayIndex = node->value;

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), arrayIndex)));

			// Create increment
			increments.push_back(new (ctx.get<ExprPreModify>()) ExprPreModify(curr, ctx.typeInt, CreateGetAddress(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false)), true));
			continue;
		}

		if(!AssertValueExpression(ctx, curr, value))
		{
			initializers.push_back(value);
			continue;
		}

		TypeFunction *functionType = getType<TypeFunction>(value->type);
		ExprBase *startCall = NULL;
		
		// If we don't have a function, get an iterator
		if(!functionType)
		{
			startCall = CreateFunctionCall(ctx, sourceInternal, CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("start")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(isType<TypeError>(startCall->type))
			{
				initializers.push_back(value);
				continue;
			}

			// Check if iteartor is a coroutine
			functionType = getType<TypeFunction>(startCall->type);

			if(functionType)
				value = startCall;
		}

		if(functionType)
		{
			// Store function pointer in a variable
			VariableData *functPtr = AllocateTemporary(ctx, sourceInternal, value->type);

			ExprBase *funcPtrInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, functPtr, false), value);

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, functPtr), funcPtrInitializer));

			if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(value))
			{
				if(!access->function->coroutine)
					Stop(ctx, curr, "ERROR: function is not a coroutine");
			}
			else
			{
				initializers.push_back(CreateFunctionCall1(ctx, sourceInternal, InplaceStr("__assertCoroutine"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, true, true));
			}

			// Create definition
			if(!type || type == ctx.typeAuto)
			{
				if(functionType->returnType == ctx.typeAuto)
				{
					Report(ctx, curr, "ERROR: function type is unresolved at this point");

					continue;
				}

				type = functionType->returnType;
			}

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call)));
			}

			// Create condition
			conditions.push_back(new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(curr, ctx.typeBool, SYN_UNARY_OP_LOGICAL_NOT, CreateFunctionCall1(ctx, curr, InplaceStr("isCoroutineReset"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, false, true)));

			// Create increment
			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				increments.push_back(CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call));
			}
		}
		else
		{
			// Store iterator in a variable
			VariableData *iterator = AllocateTemporary(ctx, sourceInternal, startCall->type);

			ExprBase *iteratorInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), startCall);
			
			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorInitializer));

			// Create condition
			conditions.push_back(CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("hasnext")), false), IntrusiveList<TypeHandle>(), NULL, false));

			// Create definition
			ExprBase *call = CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("next")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(!type || type == ctx.typeAuto)
				type = call->type;
			else
				type = ctx.GetReferenceType(type);

			if(isType<TypeError>(type))
				continue;

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = isType<TypeRef>(type);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, variable, false), call)));
		}
	}

	for(unsigned i = 0; i < iterators.size(); i++)
		ctx.AddVariable(iterators[i], true);

	ExprBase *initializer = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, initializers, NULL);

	ExprBase *condition = NULL;

	for(ExprBase *curr = conditions.head; curr; curr = curr->next)
	{
		if(!condition)
			condition = curr;
		else
			condition = CreateBinaryOp(ctx, syntax, SYN_BINARY_OP_LOGICAL_AND, condition, curr);
	}

	ExprBase *increment = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, increments, NULL);

	if(syntax->body)
		definitions.push_back(AnalyzeStatement(ctx, syntax->body));

	ExprBase *body = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, definitions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, increment, body);
}